

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<std::__cxx11::string,long>::
MapAllocator<google::protobuf::Map<std::__cxx11::string,long>::KeyValuePair>::
construct<google::protobuf::Map<std::__cxx11::string,long>::KeyValuePair,google::protobuf::Map<std::__cxx11::string,long>::KeyValuePair_const&>
          (MapAllocator<google::protobuf::Map<std::__cxx11::string,long>::KeyValuePair> *this,
          KeyValuePair *p,KeyValuePair *args)

{
  KeyValuePair *args_local;
  KeyValuePair *p_local;
  MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
  *this_local;
  
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
  KeyValuePair::KeyValuePair(p,args);
  return;
}

Assistant:

void construct(NodeType* p, Args&&... args) {
      // Clang 3.6 doesn't compile static casting to void* directly. (Issue
      // #1266) According C++ standard 5.2.9/1: "The static_cast operator shall
      // not cast away constness". So first the maybe const pointer is casted to
      // const void* and after the const void* is const casted.
      new (const_cast<void*>(static_cast<const void*>(p)))
          NodeType(std::forward<Args>(args)...);
    }